

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_string_radix_sort.h
# Opt level: O0

void __thiscall
parallel_string_radix_sort::ParallelStringRadixSort<const_unsigned_char_*>::Sort8
          (ParallelStringRadixSort<const_unsigned_char_*> *this,size_t bgn,size_t end,size_t depth,
          bool flip)

{
  size_t sVar1;
  uchar **local_8b8;
  uchar **local_8b0;
  ulong local_8a0;
  size_t i_4;
  size_t j;
  size_t e;
  size_t b;
  size_t i_3;
  unsigned_long uStack_870;
  int i_2;
  size_t s;
  size_t i_1;
  size_t i;
  size_t n;
  uint8_t *let;
  uchar **dst;
  uchar **src;
  size_t cnt [256];
  bool flip_local;
  size_t depth_local;
  size_t end_local;
  size_t bgn_local;
  ParallelStringRadixSort<const_unsigned_char_*> *this_local;
  
  memset(&src,0,0x800);
  if (flip) {
    local_8b0 = this->temp_;
  }
  else {
    local_8b0 = this->data_;
  }
  dst = local_8b0 + bgn;
  if (flip) {
    local_8b8 = this->data_;
  }
  else {
    local_8b8 = this->temp_;
  }
  let = (uint8_t *)(local_8b8 + bgn);
  n = (size_t)(this->letters8_ + bgn);
  i = end - bgn;
  for (i_1 = 0; i_1 < i; i_1 = i_1 + 1) {
    *(uchar *)(n + i_1) = dst[i_1][depth];
  }
  for (s = 0; s < i; s = s + 1) {
    cnt[(ulong)*(byte *)(n + s) - 1] = cnt[(ulong)*(byte *)(n + s) - 1] + 1;
  }
  uStack_870 = 0;
  for (i_3._4_4_ = 0; i_3._4_4_ < 0x100; i_3._4_4_ = i_3._4_4_ + 1) {
    std::swap<unsigned_long>(cnt + (long)i_3._4_4_ + -1,&stack0xfffffffffffff790);
    uStack_870 = cnt[(long)i_3._4_4_ + -1] + uStack_870;
  }
  for (b = 0; b < i; b = b + 1) {
    sVar1 = cnt[(ulong)*(byte *)(n + b) - 1];
    cnt[(ulong)*(byte *)(n + b) - 1] = sVar1 + 1;
    std::swap<unsigned_char_const*>((uchar **)(let + sVar1 * 8),dst + b);
  }
  if (!flip) {
    for (i_4 = 0; i_4 < src; i_4 = i_4 + 1) {
      std::swap<unsigned_char_const*>(dst + i_4,(uchar **)(let + i_4 * 8));
    }
  }
  for (local_8a0 = 1; local_8a0 < 0x100; local_8a0 = local_8a0 + 1) {
    if (cnt[local_8a0 - 1] != cnt[local_8a0 - 2]) {
      Recurse(this,bgn + cnt[local_8a0 - 2],bgn + cnt[local_8a0 - 1],depth + 1,
              (bool)((flip ^ 0xffU) & 1));
    }
  }
  return;
}

Assistant:

void ParallelStringRadixSort<StringType>
::Sort8(size_t bgn, size_t end, size_t depth, bool flip) {
  // Here we do not use |new| or |malloc|. This is because:
  // 1. these may be heavy bottle-necks under multi-thread, and
  // 2. the size is sufficiently small for preventing stack overflow.
  size_t cnt[1 << 8] = {};

  StringType *src = (flip ? temp_ : data_) + bgn;
  StringType *dst = (flip ? data_ : temp_) + bgn;
  uint8_t *let = letters8_ + bgn;
  size_t n = end - bgn;

  for (size_t i = 0; i < n; ++i) {
    let[i] = src[i][depth];
  }

  for (size_t i = 0; i < n; ++i) {
    ++cnt[let[i]];
  }

  size_t s = 0;
  for (int i = 0; i < 1 << 8; ++i) {
    std::swap(cnt[i], s);
    s += cnt[i];
  }

  for (size_t i = 0; i < n; ++i) {
    std::swap(dst[cnt[let[i]]++], src[i]);
  }

  if (flip == false) {
    size_t b = 0, e = cnt[0];
    for (size_t j = b; j < e; ++j) {
      std::swap(src[j], dst[j]);
    }
  }

  for (size_t i = 1; i < 1 << 8; ++i) {
    if (cnt[i] - cnt[i - 1] >= 1) {
      Recurse(bgn + cnt[i - 1], bgn + cnt[i], depth + 1, !flip);
    }
  }
}